

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::WaitOrderStatementSyntax::setChild
          (WaitOrderStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar6;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  NamedLabelSyntax *pNVar10;
  ActionBlockSyntax *pAVar11;
  logic_error *this_00;
  long *plVar12;
  char *func;
  size_type *psVar13;
  long *plVar14;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (6 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar12 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar12;
    psVar13 = (size_type *)(plVar12 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar13) {
      local_d0.field_2._M_allocated_capacity = *psVar13;
      local_d0.field_2._8_8_ = plVar12[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar13;
    }
    local_d0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x3661);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_b0 == plVar14) {
      local_a0 = *plVar14;
      lStack_98 = plVar12[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar14;
    }
    local_a8 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar12;
    plVar14 = plVar12 + 2;
    if (local_f0 == plVar14) {
      local_e0 = *plVar14;
      lStack_d8 = plVar12[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar14;
    }
    local_e8 = plVar12[1];
    *plVar12 = (long)plVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar10 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar10 = (NamedLabelSyntax *)*ppSVar9;
      if ((pNVar10->super_SyntaxNode).kind != NamedLabel) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]";
LAB_002e9d55:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,func);
      }
    }
    (this->super_StatementSyntax).label = pNVar10;
    break;
  case 1:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar9);
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar7->super_SyntaxListBase).childCount;
    sVar1 = (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 2:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->wait_order).kind = pvVar8->kind;
    (this->wait_order).field_0x2 = uVar3;
    (this->wait_order).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->wait_order).rawLen = uVar5;
    (this->wait_order).info = pIVar2;
    break;
  case 3:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->openParen).kind = pvVar8->kind;
    (this->openParen).field_0x2 = uVar3;
    (this->openParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->openParen).rawLen = uVar5;
    (this->openParen).info = pIVar2;
    break;
  case 4:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>>(*ppSVar9)
    ;
    (this->names).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->names).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->names).super_SyntaxListBase.childCount = (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->elements).size_;
    (this->names).elements.data_ = (pSVar6->elements).data_;
    (this->names).elements.size_ = sVar1;
    break;
  case 5:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->closeParen).kind = pvVar8->kind;
    (this->closeParen).field_0x2 = uVar3;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->closeParen).rawLen = uVar5;
    (this->closeParen).info = pIVar2;
    break;
  case 6:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pAVar11 = (ActionBlockSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pAVar11 = (ActionBlockSyntax *)*ppSVar9;
      if ((pAVar11->super_SyntaxNode).kind != ActionBlock) {
        func = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::ActionBlockSyntax]";
        goto LAB_002e9d55;
      }
    }
    if (pAVar11 == (ActionBlockSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::ActionBlockSyntax *>::not_null(U &&) [T = slang::syntax::ActionBlockSyntax *, U = slang::syntax::ActionBlockSyntax *]"
                );
    }
    (this->action).ptr = pAVar11;
  }
  return;
}

Assistant:

void WaitOrderStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: wait_order = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: names = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 5: closeParen = child.token(); return;
        case 6: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}